

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::ParseDiscountTag(Parser *this,TiXmlHandle *xml_handle)

{
  int iVar1;
  char *pcVar2;
  log_ostream *plVar3;
  ostream *this_00;
  void *this_01;
  bool condition;
  bool local_111;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88 [8];
  string discount_str;
  allocator<char> local_51;
  string local_50;
  TiXmlHandle local_30;
  TiXmlHandle local_28;
  TiXmlElement *local_20;
  TiXmlElement *e_Discount;
  TiXmlHandle *xml_handle_local;
  Parser *this_local;
  
  e_Discount = (TiXmlElement *)xml_handle;
  xml_handle_local = (TiXmlHandle *)this;
  util::tinyxml::TiXmlHandle::FirstChild(&local_30,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_28,(char *)&local_30);
  local_20 = util::tinyxml::TiXmlHandle::ToElement(&local_28);
  condition = local_20 != (TiXmlElement *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Cannot find Discount tag",&local_51);
  Ensure(this,condition,&local_50,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pcVar2 = util::tinyxml::TiXmlElement::GetText(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,pcVar2,&local_89);
  std::allocator<char>::~allocator(&local_89);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  DAT_00278a78 = atof(pcVar2);
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 2 < iVar1)) {
    plVar3 = logging::stream(3);
    this_00 = std::operator<<(&plVar3->super_ostream,"Discount = ");
    this_01 = (void *)std::ostream::operator<<(this_00,DAT_00278a78);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  local_111 = DAT_00278a78 < 1.0 && 0.0 < DAT_00278a78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Discount factor must be in (0, 1).",&local_b1);
  Ensure(this,local_111,&local_b0,(TiXmlBase *)local_20);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void Parser::ParseDiscountTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Discount = xml_handle.FirstChild("pomdpx").FirstChild(
		"Discount").ToElement();

	Ensure(e_Discount != NULL, "Cannot find Discount tag");

	string discount_str = e_Discount->GetText();
	Globals::config.discount = atof(discount_str.c_str());
	logi << "Discount = " << Globals::config.discount << endl;

	Ensure(Globals::config.discount < 1.0 && Globals::config.discount > 0,
		"Discount factor must be in (0, 1).", e_Discount);
}